

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRStereoNode.cpp
# Opt level: O1

void __thiscall
MinVR::VRStereoNode::VRStereoNode
          (VRStereoNode *this,string *name,float interOcularDist,VRGraphicsToolkit *gfxToolkit,
          VRStereoFormat format)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *local_68;
  _List_node_base *local_60;
  _List_node_base local_58;
  float local_44;
  string local_40;
  
  local_44 = interOcularDist;
  VRDisplayNode::VRDisplayNode(&this->super_VRDisplayNode,name);
  (this->super_VRDisplayNode)._vptr_VRDisplayNode = (_func_int **)&PTR__VRStereoNode_001778b8;
  this->_gfxToolkit = gfxToolkit;
  this->_format = format;
  this->_iod = local_44;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"HeadMatrix","");
  VRDisplayNode::_addValueNeeded(&this->super_VRDisplayNode,&local_40,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_68 = &local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"CameraMatrix","");
  p_Var2 = (_List_node_base *)operator_new(0x30);
  p_Var2[1]._M_next = p_Var2 + 2;
  if (local_68 == &local_58) {
    p_Var2[2]._M_next = (_List_node_base *)CONCAT71(local_58._M_next._1_7_,local_58._M_next._0_1_);
    p_Var2[2]._M_prev = local_58._M_prev;
  }
  else {
    p_Var2[1]._M_next = local_68;
    p_Var2[2]._M_next = (_List_node_base *)CONCAT71(local_58._M_next._1_7_,local_58._M_next._0_1_);
  }
  p_Var2[1]._M_prev = local_60;
  local_60 = (_List_node_base *)0x0;
  local_58._M_next._0_1_ = 0;
  local_68 = &local_58;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->super_VRDisplayNode)._valuesAdded.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(local_58._M_next._1_7_,local_58._M_next._0_1_) + 1);
  }
  local_68 = &local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Eye","");
  p_Var2 = (_List_node_base *)operator_new(0x30);
  p_Var2[1]._M_next = p_Var2 + 2;
  if (local_68 == &local_58) {
    p_Var2[2]._M_next = (_List_node_base *)CONCAT71(local_58._M_next._1_7_,local_58._M_next._0_1_);
    p_Var2[2]._M_prev = local_58._M_prev;
  }
  else {
    p_Var2[1]._M_next = local_68;
    p_Var2[2]._M_next = (_List_node_base *)CONCAT71(local_58._M_next._1_7_,local_58._M_next._0_1_);
  }
  p_Var2[1]._M_prev = local_60;
  local_60 = (_List_node_base *)0x0;
  local_58._M_next._0_1_ = 0;
  local_68 = &local_58;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->super_VRDisplayNode)._valuesAdded.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(local_58._M_next._1_7_,local_58._M_next._0_1_) + 1);
  }
  local_68 = &local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"StereoFormat","");
  p_Var2 = (_List_node_base *)operator_new(0x30);
  p_Var2[1]._M_next = p_Var2 + 2;
  if (local_68 == &local_58) {
    p_Var2[2]._M_next = (_List_node_base *)CONCAT71(local_58._M_next._1_7_,local_58._M_next._0_1_);
    p_Var2[2]._M_prev = local_58._M_prev;
  }
  else {
    p_Var2[1]._M_next = local_68;
    p_Var2[2]._M_next = (_List_node_base *)CONCAT71(local_58._M_next._1_7_,local_58._M_next._0_1_);
  }
  p_Var2[1]._M_prev = local_60;
  local_60 = (_List_node_base *)0x0;
  local_58._M_next._0_1_ = 0;
  local_68 = &local_58;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->super_VRDisplayNode)._valuesAdded.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(local_58._M_next._1_7_,local_58._M_next._0_1_) + 1);
  }
  return;
}

Assistant:

VRStereoNode::VRStereoNode(const std::string &name, float interOcularDist, VRGraphicsToolkit *gfxToolkit, VRStereoFormat format) :
  VRDisplayNode(name), _gfxToolkit(gfxToolkit), _format(format), _iod(interOcularDist) {

  // in:
  _addValueNeeded("HeadMatrix");

  // out:
  _valuesAdded.push_back("CameraMatrix");
  _valuesAdded.push_back("Eye");
  _valuesAdded.push_back("StereoFormat");

  // There are also some conditional requirements such as "ViewportX" that we
  // only need under some conditions.  These are checked for below.
}